

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::ParsedIR::get_decoration(ParsedIR *this,ID id,Decoration decoration)

{
  bool bVar1;
  Meta *pMVar2;
  FPRoundingMode FVar3;
  
  pMVar2 = find_meta(this,id);
  FVar3 = FPRoundingModeRTE;
  if ((pMVar2 != (Meta *)0x0) &&
     (bVar1 = Bitset::get(&(pMVar2->decoration).decoration_flags,decoration), bVar1)) {
    FVar3 = FPRoundingModeRTZ;
    switch(decoration) {
    case DecorationStream:
      FVar3 = (pMVar2->decoration).stream;
      break;
    case DecorationLocation:
      FVar3 = (pMVar2->decoration).location;
      break;
    case DecorationComponent:
      FVar3 = (pMVar2->decoration).component;
      break;
    case DecorationIndex:
      FVar3 = (pMVar2->decoration).index;
      break;
    case DecorationBinding:
      FVar3 = (pMVar2->decoration).binding;
      break;
    case DecorationDescriptorSet:
      FVar3 = (pMVar2->decoration).set;
      break;
    case DecorationOffset:
      FVar3 = (pMVar2->decoration).offset;
      break;
    case DecorationXfbBuffer:
      FVar3 = (pMVar2->decoration).xfb_buffer;
      break;
    case DecorationXfbStride:
      FVar3 = (pMVar2->decoration).xfb_stride;
      break;
    case DecorationFuncParamAttr:
    case DecorationFPFastMathMode:
    case DecorationLinkageAttributes:
    case DecorationNoContraction:
      break;
    case DecorationFPRoundingMode:
      FVar3 = (pMVar2->decoration).fp_rounding_mode;
      break;
    case DecorationInputAttachmentIndex:
      FVar3 = (pMVar2->decoration).input_attachment;
      break;
    default:
      if (decoration == DecorationSpecId) {
        FVar3 = (pMVar2->decoration).spec_id;
      }
      else if (decoration == DecorationArrayStride) {
        FVar3 = (pMVar2->decoration).array_stride;
      }
      else if (decoration == DecorationMatrixStride) {
        FVar3 = (pMVar2->decoration).matrix_stride;
      }
      else if (decoration == DecorationBuiltIn) {
        FVar3 = (pMVar2->decoration).builtin_type;
      }
    }
  }
  return FVar3;
}

Assistant:

uint32_t ParsedIR::get_decoration(ID id, Decoration decoration) const
{
	auto *m = find_meta(id);
	if (!m)
		return 0;

	auto &dec = m->decoration;
	if (!dec.decoration_flags.get(decoration))
		return 0;

	switch (decoration)
	{
	case DecorationBuiltIn:
		return dec.builtin_type;
	case DecorationLocation:
		return dec.location;
	case DecorationComponent:
		return dec.component;
	case DecorationOffset:
		return dec.offset;
	case DecorationXfbBuffer:
		return dec.xfb_buffer;
	case DecorationXfbStride:
		return dec.xfb_stride;
	case DecorationStream:
		return dec.stream;
	case DecorationBinding:
		return dec.binding;
	case DecorationDescriptorSet:
		return dec.set;
	case DecorationInputAttachmentIndex:
		return dec.input_attachment;
	case DecorationSpecId:
		return dec.spec_id;
	case DecorationArrayStride:
		return dec.array_stride;
	case DecorationMatrixStride:
		return dec.matrix_stride;
	case DecorationIndex:
		return dec.index;
	case DecorationFPRoundingMode:
		return dec.fp_rounding_mode;
	default:
		return 1;
	}
}